

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

void __thiscall CppJieba::TrieNodeInfo::TrieNodeInfo(TrieNodeInfo *this,TrieNodeInfo *nodeInfo)

{
  pointer pcVar1;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->word,&nodeInfo->word);
  this->freq = nodeInfo->freq;
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  pcVar1 = (nodeInfo->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->tag,pcVar1,pcVar1 + (nodeInfo->tag)._M_string_length);
  this->logFreq = nodeInfo->logFreq;
  return;
}

Assistant:

TrieNodeInfo(const TrieNodeInfo& nodeInfo):word(nodeInfo.word), freq(nodeInfo.freq), tag(nodeInfo.tag), logFreq(nodeInfo.logFreq)
        {
        }